

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack_template.h
# Opt level: O0

int template_execute(template_context *ctx,char *data,size_t len,size_t *off)

{
  uint32_t uVar1;
  ulong uVar2;
  long lVar3;
  msgpack_object o;
  msgpack_object v;
  uint16_t uVar4;
  float d;
  uint32_t uVar5;
  template_stack *ptVar6;
  template_stack *ptVar7;
  byte *pbVar8;
  msgpack_object *c_00;
  uint32_t tmp_15;
  uint16_t tmp_14;
  uint32_t tmp_13;
  uint16_t tmp_12;
  uint32_t tmp_11;
  uint32_t tmp_10;
  uint32_t tmp_9;
  uint16_t tmp_8;
  uint16_t tmp_7;
  uint16_t tmp_6;
  int64_t tmp_5;
  int32_t tmp_4;
  int16_t tmp_3;
  uint64_t tmp_2;
  uint32_t tmp_1;
  uint16_t tmp;
  anon_union_8_2_947300a4 mem_1;
  anon_union_4_2_947300a4 mem;
  int ret;
  template_stack *c;
  msgpack_object obj;
  unpack_user *user;
  template_stack *stack;
  uint local_48;
  uint top;
  uint cs;
  uint trail;
  void *n;
  uchar *pe;
  uchar *p;
  size_t *off_local;
  size_t len_local;
  char *data_local;
  template_context *ctx_local;
  
  if (len < *off) {
    __assert_fail("len >= *off",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/xutiezhu[P]tqapi/lib/msgpack/include/msgpack/unpack_template.h"
                  ,0x5b,
                  "int template_execute(struct template_context *, const char *, size_t, size_t *)")
    ;
  }
  pe = (uchar *)(data + *off);
  _cs = (uchar *)0x0;
  top = ctx->trail;
  local_48 = ctx->cs;
  stack._4_4_ = ctx->top;
  ptVar6 = ctx->stack;
  obj.via.array.ptr = (msgpack_object *)ctx;
joined_r0x001f921e:
  if (pe != (uchar *)(data + len)) {
    if (local_48 != 0) goto LAB_001f9631;
    pbVar8 = pe;
    switch(*pe) {
    case 0x80:
    case 0x81:
    case 0x82:
    case 0x83:
    case 0x84:
    case 0x85:
    case 0x86:
    case 0x87:
    case 0x88:
    case 0x89:
    case 0x8a:
    case 0x8b:
    case 0x8c:
    case 0x8d:
    case 0x8e:
    case 0x8f:
      if (stack._4_4_ < 0x20) {
        mem_1.i._4_4_ =
             template_callback_map
                       ((unpack_user *)obj.via.array.ptr,*pe & 0xf,&ptVar6[stack._4_4_].obj);
        if (-1 < (int)mem_1.i._4_4_) {
          if ((*pe & 0xf) == 0) {
            ptVar7 = ptVar6 + stack._4_4_;
            c = *(template_stack **)&ptVar7->obj;
            obj._0_8_ = (ptVar7->obj).via.u64;
            obj.via.u64 = (uint64_t)(ptVar7->obj).via.array.ptr;
            goto LAB_001fa156;
          }
          ptVar6[stack._4_4_].ct = 1;
          ptVar6[stack._4_4_].count = (ulong)(*pe & 0xf);
          stack._4_4_ = stack._4_4_ + 1;
          goto LAB_001fa304;
        }
      }
      else {
        mem_1.i._4_4_ = 0xfffffffe;
      }
      goto LAB_001fa360;
    case 0x90:
    case 0x91:
    case 0x92:
    case 0x93:
    case 0x94:
    case 0x95:
    case 0x96:
    case 0x97:
    case 0x98:
    case 0x99:
    case 0x9a:
    case 0x9b:
    case 0x9c:
    case 0x9d:
    case 0x9e:
    case 0x9f:
      if (stack._4_4_ < 0x20) {
        mem_1.i._4_4_ =
             template_callback_array
                       ((unpack_user *)obj.via.array.ptr,*pe & 0xf,&ptVar6[stack._4_4_].obj);
        if (-1 < (int)mem_1.i._4_4_) {
          if ((*pe & 0xf) == 0) {
            ptVar7 = ptVar6 + stack._4_4_;
            c = *(template_stack **)&ptVar7->obj;
            obj._0_8_ = (ptVar7->obj).via.u64;
            obj.via.u64 = (uint64_t)(ptVar7->obj).via.array.ptr;
            goto LAB_001fa156;
          }
          ptVar6[stack._4_4_].ct = 0;
          ptVar6[stack._4_4_].count = (ulong)(*pe & 0xf);
          stack._4_4_ = stack._4_4_ + 1;
          goto LAB_001fa304;
        }
      }
      else {
        mem_1.i._4_4_ = 0xfffffffe;
      }
      goto LAB_001fa360;
    case 0xa0:
    case 0xa1:
    case 0xa2:
    case 0xa3:
    case 0xa4:
    case 0xa5:
    case 0xa6:
    case 0xa7:
    case 0xa8:
    case 0xa9:
    case 0xaa:
    case 0xab:
    case 0xac:
    case 0xad:
    case 0xae:
    case 0xaf:
    case 0xb0:
    case 0xb1:
    case 0xb2:
    case 0xb3:
    case 0xb4:
    case 0xb5:
    case 0xb6:
    case 0xb7:
    case 0xb8:
    case 0xb9:
    case 0xba:
    case 0xbb:
    case 0xbc:
    case 0xbd:
    case 0xbe:
    case 0xbf:
      top = *pe & 0x1f;
      if ((*pe & 0x1f) != 0) {
        local_48 = 0x20;
        goto LAB_001f9625;
      }
LAB_001f9d86:
      mem_1.i._4_4_ =
           template_callback_str
                     ((unpack_user *)obj.via.array.ptr,data,(char *)_cs,top,(msgpack_object *)&c);
      pbVar8 = pe;
      goto joined_r0x001f9863;
    case 0xc0:
    case 0xc1:
    case 0xc2:
    case 0xc3:
    case 0xc4:
    case 0xc5:
    case 0xc6:
    case 199:
    case 200:
    case 0xc9:
    case 0xca:
    case 0xcb:
    case 0xcc:
    case 0xcd:
    case 0xce:
    case 0xcf:
    case 0xd0:
    case 0xd1:
    case 0xd2:
    case 0xd3:
    case 0xd4:
    case 0xd5:
    case 0xd6:
    case 0xd7:
    case 0xd8:
    case 0xd9:
    case 0xda:
    case 0xdb:
    case 0xdc:
    case 0xdd:
    case 0xde:
    case 0xdf:
      goto switchD_001f9267_caseD_c0;
    case 0xe0:
    case 0xe1:
    case 0xe2:
    case 0xe3:
    case 0xe4:
    case 0xe5:
    case 0xe6:
    case 0xe7:
    case 0xe8:
    case 0xe9:
    case 0xea:
    case 0xeb:
    case 0xec:
    case 0xed:
    case 0xee:
    case 0xef:
    case 0xf0:
    case 0xf1:
    case 0xf2:
    case 0xf3:
    case 0xf4:
    case 0xf5:
    case 0xf6:
    case 0xf7:
    case 0xf8:
    case 0xf9:
    case 0xfa:
    case 0xfb:
    case 0xfc:
    case 0xfd:
    case 0xfe:
    case 0xff:
      mem_1.i._4_4_ =
           template_callback_int8((unpack_user *)obj.via.array.ptr,*pe,(msgpack_object *)&c);
      goto joined_r0x001f9863;
    default:
      if (*pe < 0x80) {
        mem_1.i._4_4_ =
             template_callback_uint8((unpack_user *)obj.via.array.ptr,*pe,(msgpack_object *)&c);
        goto joined_r0x001f9863;
      }
      mem_1.i._4_4_ = 0xffffffff;
      goto LAB_001fa360;
    }
  }
LAB_001fa359:
  mem_1.i._4_4_ = 0;
LAB_001fa360:
  ctx->cs = local_48;
  ctx->trail = top;
  ctx->top = stack._4_4_;
  *off = (long)pe - (long)data;
  return mem_1.i._4_4_;
switchD_001f9267_caseD_c0:
  switch(*pe) {
  case 0xc0:
    mem_1.i._4_4_ = template_callback_nil((unpack_user *)obj.via.array.ptr,(msgpack_object *)&c);
    goto joined_r0x001f9863;
  default:
    mem_1.i._4_4_ = 0xffffffff;
    goto LAB_001fa360;
  case 0xc2:
    mem_1.i._4_4_ = template_callback_false((unpack_user *)obj.via.array.ptr,(msgpack_object *)&c);
    goto joined_r0x001f9863;
  case 0xc3:
    mem_1.i._4_4_ = template_callback_true((unpack_user *)obj.via.array.ptr,(msgpack_object *)&c);
    goto joined_r0x001f9863;
  case 0xc4:
  case 0xc5:
  case 0xc6:
    top = 1 << (*pe & 3);
    local_48 = *pe & 0x1f;
    break;
  case 199:
  case 200:
  case 0xc9:
    top = 1 << (*pe + 1 & 3);
    local_48 = *pe & 0x1f;
    break;
  case 0xca:
  case 0xcb:
  case 0xcc:
  case 0xcd:
  case 0xce:
  case 0xcf:
  case 0xd0:
  case 0xd1:
  case 0xd2:
  case 0xd3:
    top = 1 << (*pe & 3);
    local_48 = *pe & 0x1f;
    break;
  case 0xd4:
  case 0xd5:
  case 0xd6:
  case 0xd7:
    top = (1 << (*pe & 3)) + 1;
    if (top != 0) {
      local_48 = 0x22;
      break;
    }
LAB_001f9de0:
    mem_1.i._4_4_ =
         template_callback_ext
                   ((unpack_user *)obj.via.array.ptr,data,(char *)_cs,top,(msgpack_object *)&c);
    pbVar8 = pe;
joined_r0x001f9863:
    pe = pbVar8;
    if (-1 < (int)mem_1.i._4_4_) {
LAB_001fa156:
      do {
        if (stack._4_4_ == 0) {
          *(template_stack **)&ptVar6->obj = c;
          ctx->stack[0].obj.via.u64 = obj._0_8_;
          ctx->stack[0].obj.via.array.ptr = (msgpack_object *)obj.via.u64;
          mem_1.i._4_4_ = 1;
          pe = pe + 1;
          break;
        }
        c_00 = &ptVar6[stack._4_4_ - 1].obj;
        uVar1 = c_00[1].via.array.size;
        if (uVar1 == 0) {
          o.via.u64 = obj._0_8_;
          o._0_8_ = c;
          o.via._8_8_ = obj.via.u64;
          mem_1.i._4_4_ = template_callback_array_item((unpack_user *)obj.via.array.ptr,c_00,o);
          if ((int)mem_1.i._4_4_ < 0) break;
          lVar3 = *(long *)(c_00 + 1);
          *(long *)(c_00 + 1) = lVar3 + -1;
          if (lVar3 + -1 != 0) goto LAB_001fa304;
          c = *(template_stack **)c_00;
          obj._0_8_ = (c_00->via).u64;
          obj.via.u64 = (uint64_t)(c_00->via).array.ptr;
          stack._4_4_ = stack._4_4_ - 1;
          goto LAB_001fa156;
        }
        if (uVar1 == 1) {
          c_00[1].via.array.ptr = &c->obj;
          c_00[2].type = obj.type;
          *(undefined4 *)&c_00[2].field_0x4 = obj._4_4_;
          c_00[2].via.u64 = obj.via.u64;
          c_00[1].via.array.size = 2;
          goto LAB_001fa304;
        }
        if (uVar1 != 2) {
          mem_1.i._4_4_ = 0xffffffff;
          break;
        }
        v.via.u64 = obj._0_8_;
        v._0_8_ = c;
        v.via._8_8_ = obj.via.u64;
        mem_1.i._4_4_ =
             template_callback_map_item
                       ((unpack_user *)obj.via.array.ptr,c_00,
                        *(msgpack_object *)((long)&c_00[1].via + 8),v);
        if ((int)mem_1.i._4_4_ < 0) break;
        lVar3 = *(long *)(c_00 + 1);
        *(long *)(c_00 + 1) = lVar3 + -1;
        if (lVar3 + -1 != 0) goto LAB_001fa2ee;
        c = *(template_stack **)c_00;
        obj._0_8_ = (c_00->via).u64;
        obj.via.u64 = (uint64_t)(c_00->via).array.ptr;
        stack._4_4_ = stack._4_4_ - 1;
      } while( true );
    }
    goto LAB_001fa360;
  case 0xd8:
    top = 0x11;
    local_48 = 0x22;
    break;
  case 0xd9:
  case 0xda:
  case 0xdb:
    top = 1 << ((*pe & 3) - 1 & 0x1f);
    local_48 = *pe & 0x1f;
    break;
  case 0xdc:
  case 0xdd:
  case 0xde:
  case 0xdf:
    top = 2 << (*pe & 1);
    local_48 = *pe & 0x1f;
  }
LAB_001f9625:
  pe = pe + 1;
LAB_001f9631:
  if ((ulong)((long)(data + len) - (long)pe) < (ulong)top) goto LAB_001fa359;
  _cs = pe;
  pbVar8 = pe + (top - 1);
  switch(local_48) {
  case 4:
    top = (uint)*pe;
    if (top != 0) {
      local_48 = 0x21;
      pe = pbVar8;
      goto LAB_001f9625;
    }
    break;
  case 5:
    uVar4 = ntohs(*(uint16_t *)pe);
    top = (uint)uVar4;
    if (top != 0) {
      local_48 = 0x21;
      pe = pbVar8;
      goto LAB_001f9625;
    }
    break;
  case 6:
    top = ntohl(*(uint32_t *)pe);
    if (top != 0) {
      local_48 = 0x21;
      pe = pbVar8;
      goto LAB_001f9625;
    }
    break;
  case 7:
    top = *pe + 1;
    pe = pbVar8;
    if (top == 0) goto LAB_001f9de0;
    local_48 = 0x22;
    goto LAB_001f9625;
  case 8:
    uVar4 = ntohs(*(uint16_t *)pe);
    top = uVar4 + 1;
    pe = pbVar8;
    if (top == 0) goto LAB_001f9de0;
    local_48 = 0x22;
    goto LAB_001f9625;
  case 9:
    uVar5 = ntohl(*(uint32_t *)pe);
    top = uVar5 + 1;
    pe = pbVar8;
    if (top == 0) goto LAB_001f9de0;
    local_48 = 0x22;
    goto LAB_001f9625;
  case 10:
    d = (float)ntohl(*(uint32_t *)pe);
    mem_1.i._4_4_ = template_callback_float((unpack_user *)obj.via.array.ptr,d,(msgpack_object *)&c)
    ;
    goto joined_r0x001f9863;
  case 0xb:
    uVar2 = *(ulong *)pe;
    mem_1.i._4_4_ =
         template_callback_double
                   ((unpack_user *)obj.via.array.ptr,
                    (double)(uVar2 << 0x38 | (uVar2 & 0xff00) << 0x28 | (uVar2 & 0xff0000) << 0x18 |
                             (uVar2 & 0xff000000) << 8 | uVar2 >> 8 & 0xff000000 |
                             uVar2 >> 0x18 & 0xff0000 | uVar2 >> 0x28 & 0xff00 | uVar2 >> 0x38),
                    (msgpack_object *)&c);
    goto joined_r0x001f9863;
  case 0xc:
    mem_1.i._4_4_ =
         template_callback_uint8((unpack_user *)obj.via.array.ptr,*pe,(msgpack_object *)&c);
    goto joined_r0x001f9863;
  case 0xd:
    uVar4 = ntohs(*(uint16_t *)pe);
    mem_1.i._4_4_ =
         template_callback_uint16((unpack_user *)obj.via.array.ptr,uVar4,(msgpack_object *)&c);
    goto joined_r0x001f9863;
  case 0xe:
    uVar5 = ntohl(*(uint32_t *)pe);
    mem_1.i._4_4_ =
         template_callback_uint32((unpack_user *)obj.via.array.ptr,uVar5,(msgpack_object *)&c);
    goto joined_r0x001f9863;
  case 0xf:
    uVar2 = *(ulong *)pe;
    mem_1.i._4_4_ =
         template_callback_uint64
                   ((unpack_user *)obj.via.array.ptr,
                    uVar2 << 0x38 | (uVar2 & 0xff00) << 0x28 | (uVar2 & 0xff0000) << 0x18 |
                    (uVar2 & 0xff000000) << 8 | uVar2 >> 8 & 0xff000000 | uVar2 >> 0x18 & 0xff0000 |
                    uVar2 >> 0x28 & 0xff00 | uVar2 >> 0x38,(msgpack_object *)&c);
    goto joined_r0x001f9863;
  case 0x10:
    mem_1.i._4_4_ =
         template_callback_int8((unpack_user *)obj.via.array.ptr,*pe,(msgpack_object *)&c);
    goto joined_r0x001f9863;
  case 0x11:
    uVar4 = ntohs(*(uint16_t *)pe);
    mem_1.i._4_4_ =
         template_callback_int16((unpack_user *)obj.via.array.ptr,uVar4,(msgpack_object *)&c);
    goto joined_r0x001f9863;
  case 0x12:
    uVar5 = ntohl(*(uint32_t *)pe);
    mem_1.i._4_4_ =
         template_callback_int32((unpack_user *)obj.via.array.ptr,uVar5,(msgpack_object *)&c);
    goto joined_r0x001f9863;
  case 0x13:
    uVar2 = *(ulong *)pe;
    mem_1.i._4_4_ =
         template_callback_int64
                   ((unpack_user *)obj.via.array.ptr,
                    uVar2 << 0x38 | (uVar2 & 0xff00) << 0x28 | (uVar2 & 0xff0000) << 0x18 |
                    (uVar2 & 0xff000000) << 8 | uVar2 >> 8 & 0xff000000 | uVar2 >> 0x18 & 0xff0000 |
                    uVar2 >> 0x28 & 0xff00 | uVar2 >> 0x38,(msgpack_object *)&c);
    goto joined_r0x001f9863;
  case 0x14:
    top = 2;
    local_48 = 0x22;
    pe = pbVar8;
    goto LAB_001f9625;
  case 0x15:
    top = 3;
    local_48 = 0x22;
    pe = pbVar8;
    goto LAB_001f9625;
  case 0x16:
    top = 5;
    local_48 = 0x22;
    pe = pbVar8;
    goto LAB_001f9625;
  case 0x17:
    top = 9;
    local_48 = 0x22;
    pe = pbVar8;
    goto LAB_001f9625;
  case 0x18:
    top = 0x11;
    local_48 = 0x22;
    pe = pbVar8;
    goto LAB_001f9625;
  case 0x19:
    top = (uint)*pe;
    pe = pbVar8;
    if (top == 0) goto LAB_001f9d86;
    local_48 = 0x20;
    goto LAB_001f9625;
  case 0x1a:
    uVar4 = ntohs(*(uint16_t *)pe);
    top = (uint)uVar4;
    pe = pbVar8;
    if (top == 0) goto LAB_001f9d86;
    local_48 = 0x20;
    goto LAB_001f9625;
  case 0x1b:
    top = ntohl(*(uint32_t *)pe);
    pe = pbVar8;
    if (top != 0) goto LAB_001f9cfd;
    goto LAB_001f9d86;
  case 0x1c:
    uVar4 = ntohs(*(uint16_t *)pe);
    if (0x1f < stack._4_4_) {
      mem_1.i._4_4_ = 0xfffffffe;
      pe = pbVar8;
      goto LAB_001fa360;
    }
    mem_1.i._4_4_ =
         template_callback_array
                   ((unpack_user *)obj.via.array.ptr,(uint)uVar4,&ptVar6[stack._4_4_].obj);
    pe = pbVar8;
    if ((int)mem_1.i._4_4_ < 0) goto LAB_001fa360;
    if (uVar4 != 0) {
      ptVar6[stack._4_4_].ct = 0;
      ptVar6[stack._4_4_].count = (ulong)uVar4;
      stack._4_4_ = stack._4_4_ + 1;
      goto LAB_001fa304;
    }
    ptVar7 = ptVar6 + stack._4_4_;
    c = *(template_stack **)&ptVar7->obj;
    obj._0_8_ = (ptVar7->obj).via.u64;
    obj.via.u64 = (uint64_t)(ptVar7->obj).via.array.ptr;
    goto LAB_001fa156;
  case 0x1d:
    uVar5 = ntohl(*(uint32_t *)pe);
    if (0x1f < stack._4_4_) {
      mem_1.i._4_4_ = 0xfffffffe;
      pe = pbVar8;
      goto LAB_001fa360;
    }
    mem_1.i._4_4_ =
         template_callback_array((unpack_user *)obj.via.array.ptr,uVar5,&ptVar6[stack._4_4_].obj);
    pe = pbVar8;
    if ((int)mem_1.i._4_4_ < 0) goto LAB_001fa360;
    if (uVar5 != 0) {
      ptVar6[stack._4_4_].ct = 0;
      ptVar6[stack._4_4_].count = (ulong)uVar5;
      stack._4_4_ = stack._4_4_ + 1;
      goto LAB_001fa304;
    }
    ptVar7 = ptVar6 + stack._4_4_;
    c = *(template_stack **)&ptVar7->obj;
    obj._0_8_ = (ptVar7->obj).via.u64;
    obj.via.u64 = (uint64_t)(ptVar7->obj).via.array.ptr;
    goto LAB_001fa156;
  case 0x1e:
    uVar4 = ntohs(*(uint16_t *)pe);
    if (0x1f < stack._4_4_) {
      mem_1.i._4_4_ = 0xfffffffe;
      pe = pbVar8;
      goto LAB_001fa360;
    }
    mem_1.i._4_4_ =
         template_callback_map
                   ((unpack_user *)obj.via.array.ptr,(uint)uVar4,&ptVar6[stack._4_4_].obj);
    pe = pbVar8;
    if ((int)mem_1.i._4_4_ < 0) goto LAB_001fa360;
    if (uVar4 != 0) {
      ptVar6[stack._4_4_].ct = 1;
      ptVar6[stack._4_4_].count = (ulong)uVar4;
      stack._4_4_ = stack._4_4_ + 1;
      goto LAB_001fa304;
    }
    ptVar7 = ptVar6 + stack._4_4_;
    c = *(template_stack **)&ptVar7->obj;
    obj._0_8_ = (ptVar7->obj).via.u64;
    obj.via.u64 = (uint64_t)(ptVar7->obj).via.array.ptr;
    goto LAB_001fa156;
  case 0x1f:
    uVar5 = ntohl(*(uint32_t *)pe);
    if (0x1f < stack._4_4_) {
      mem_1.i._4_4_ = 0xfffffffe;
      pe = pbVar8;
      goto LAB_001fa360;
    }
    mem_1.i._4_4_ =
         template_callback_map((unpack_user *)obj.via.array.ptr,uVar5,&ptVar6[stack._4_4_].obj);
    pe = pbVar8;
    if ((int)mem_1.i._4_4_ < 0) goto LAB_001fa360;
    if (uVar5 != 0) {
      ptVar6[stack._4_4_].ct = 1;
      ptVar6[stack._4_4_].count = (ulong)uVar5;
      stack._4_4_ = stack._4_4_ + 1;
      goto LAB_001fa304;
    }
    ptVar7 = ptVar6 + stack._4_4_;
    c = *(template_stack **)&ptVar7->obj;
    obj._0_8_ = (ptVar7->obj).via.u64;
    obj.via.u64 = (uint64_t)(ptVar7->obj).via.array.ptr;
    goto LAB_001fa156;
  case 0x20:
    pe = pbVar8;
    goto LAB_001f9d86;
  case 0x21:
    break;
  case 0x22:
    pe = pbVar8;
    goto LAB_001f9de0;
  default:
    mem_1.i._4_4_ = 0xffffffff;
    pe = pbVar8;
    goto LAB_001fa360;
  }
  mem_1.i._4_4_ =
       template_callback_bin
                 ((unpack_user *)obj.via.array.ptr,data,(char *)pe,top,(msgpack_object *)&c);
  goto joined_r0x001f9863;
LAB_001f9cfd:
  local_48 = 0x20;
  goto LAB_001f9625;
LAB_001fa2ee:
  c_00[1].via.array.size = 1;
LAB_001fa304:
  local_48 = 0;
  pe = pe + 1;
  goto joined_r0x001f921e;
}

Assistant:

msgpack_unpack_func(int, _execute)(msgpack_unpack_struct(_context)* ctx, const char* data, size_t len, size_t* off)
{
    assert(len >= *off);
    {
        const unsigned char* p = (unsigned char*)data + *off;
        const unsigned char* const pe = (unsigned char*)data + len;
        const void* n = NULL;

        unsigned int trail = ctx->trail;
        unsigned int cs = ctx->cs;
        unsigned int top = ctx->top;
        msgpack_unpack_struct(_stack)* stack = ctx->stack;
        /*
        unsigned int stack_size = ctx->stack_size;
        */
        msgpack_unpack_user* user = &ctx->user;

        msgpack_unpack_object obj;
        msgpack_unpack_struct(_stack)* c = NULL;

        int ret;

#define push_simple_value(func) \
        ret = msgpack_unpack_callback(func)(user, &obj); \
        if(ret < 0) { goto _failed; } \
        goto _push
#define push_fixed_value(func, arg) \
        ret = msgpack_unpack_callback(func)(user, arg, &obj); \
        if(ret < 0) { goto _failed; } \
        goto _push
#define push_variable_value(func, base, pos, len) \
        ret = msgpack_unpack_callback(func)(user, \
            (const char*)base, (const char*)pos, len, &obj); \
        if(ret < 0) { goto _failed; } \
        goto _push

#define again_fixed_trail(_cs, trail_len) \
        trail = trail_len; \
        cs = _cs; \
        goto _fixed_trail_again
#define again_fixed_trail_if_zero(_cs, trail_len, ifzero) \
        trail = trail_len; \
        if(trail == 0) { goto ifzero; } \
        cs = _cs; \
        goto _fixed_trail_again

#define start_container(func, count_, ct_) \
        if(top >= MSGPACK_EMBED_STACK_SIZE) { \
            ret = MSGPACK_UNPACK_NOMEM_ERROR; \
            goto _failed; \
        } /* FIXME */ \
        ret = msgpack_unpack_callback(func)(user, count_, &stack[top].obj); \
        if(ret < 0) { goto _failed; } \
        if((count_) == 0) { obj = stack[top].obj; goto _push; } \
        stack[top].ct = ct_; \
        stack[top].count = count_; \
        ++top; \
        goto _header_again

#define NEXT_CS(p) \
        ((unsigned int)*p & 0x1f)

#ifdef USE_CASE_RANGE
#define SWITCH_RANGE_BEGIN     switch(*p) {
#define SWITCH_RANGE(FROM, TO) case FROM ... TO:
#define SWITCH_RANGE_DEFAULT   default:
#define SWITCH_RANGE_END       }
#else
#define SWITCH_RANGE_BEGIN     { if(0) {
#define SWITCH_RANGE(FROM, TO) } else if(FROM <= *p && *p <= TO) {
#define SWITCH_RANGE_DEFAULT   } else {
#define SWITCH_RANGE_END       } }
#endif

        if(p == pe) { goto _out; }
        do {
            switch(cs) {
            case MSGPACK_CS_HEADER:
                SWITCH_RANGE_BEGIN
                SWITCH_RANGE(0x00, 0x7f)  // Positive Fixnum
                    push_fixed_value(_uint8, *(uint8_t*)p);
                SWITCH_RANGE(0xe0, 0xff)  // Negative Fixnum
                    push_fixed_value(_int8, *(int8_t*)p);
                SWITCH_RANGE(0xc0, 0xdf)  // Variable
                    switch(*p) {
                    case 0xc0:  // nil
                        push_simple_value(_nil);
                    //case 0xc1:  // string
                    //  again_terminal_trail(NEXT_CS(p), p+1);
                    case 0xc2:  // false
                        push_simple_value(_false);
                    case 0xc3:  // true
                        push_simple_value(_true);
                    case 0xc4: // bin 8
                    case 0xc5: // bin 16
                    case 0xc6: // bin 32
                        again_fixed_trail(NEXT_CS(p), 1 << (((unsigned int)*p) & 0x03));
                    case 0xc7: // ext 8
                    case 0xc8: // ext 16
                    case 0xc9: // ext 32
                        again_fixed_trail(NEXT_CS(p), 1 << ((((unsigned int)*p) + 1) & 0x03));
                    case 0xca:  // float
                    case 0xcb:  // double
                    case 0xcc:  // unsigned int  8
                    case 0xcd:  // unsigned int 16
                    case 0xce:  // unsigned int 32
                    case 0xcf:  // unsigned int 64
                    case 0xd0:  // signed int  8
                    case 0xd1:  // signed int 16
                    case 0xd2:  // signed int 32
                    case 0xd3:  // signed int 64
                        again_fixed_trail(NEXT_CS(p), 1 << (((unsigned int)*p) & 0x03));
                    case 0xd4:  // fixext 1
                    case 0xd5:  // fixext 2
                    case 0xd6:  // fixext 4
                    case 0xd7:  // fixext 8
                        again_fixed_trail_if_zero(MSGPACK_ACS_EXT_VALUE,
                            (1 << (((unsigned int)*p) & 0x03)) + 1, _ext_zero);
                    case 0xd8:  // fixext 16
                        again_fixed_trail_if_zero(MSGPACK_ACS_EXT_VALUE, 16+1, _ext_zero);

                    case 0xd9:  // str 8
                    case 0xda:  // str 16
                    case 0xdb:  // str 32
                        again_fixed_trail(NEXT_CS(p), 1 << ((((unsigned int)*p) & 0x03) - 1));
                    case 0xdc:  // array 16
                    case 0xdd:  // array 32
                    case 0xde:  // map 16
                    case 0xdf:  // map 32
                        again_fixed_trail(NEXT_CS(p), 2u << (((unsigned int)*p) & 0x01));
                    default:
                        ret = MSGPACK_UNPACK_PARSE_ERROR;
                        goto _failed;
                    }
                SWITCH_RANGE(0xa0, 0xbf)  // FixStr
                    again_fixed_trail_if_zero(MSGPACK_ACS_STR_VALUE, ((unsigned int)*p & 0x1f), _str_zero);
                SWITCH_RANGE(0x90, 0x9f)  // FixArray
                    start_container(_array, ((unsigned int)*p) & 0x0f, MSGPACK_CT_ARRAY_ITEM);
                SWITCH_RANGE(0x80, 0x8f)  // FixMap
                    start_container(_map, ((unsigned int)*p) & 0x0f, MSGPACK_CT_MAP_KEY);

                SWITCH_RANGE_DEFAULT
                    ret = MSGPACK_UNPACK_PARSE_ERROR;
                    goto _failed;
                SWITCH_RANGE_END
                // end MSGPACK_CS_HEADER


            _fixed_trail_again:
                ++p;

            default:
                if((size_t)(pe - p) < trail) { goto _out; }
                n = p;  p += trail - 1;
                switch(cs) {
                //case MSGPACK_CS_
                //case MSGPACK_CS_
                case MSGPACK_CS_FLOAT: {
                        union { uint32_t i; float f; } mem;
                        _msgpack_load32(uint32_t, n, &mem.i);
                        push_fixed_value(_float, mem.f); }
                case MSGPACK_CS_DOUBLE: {
                        union { uint64_t i; double f; } mem;
                        _msgpack_load64(uint64_t, n, &mem.i);
#if defined(TARGET_OS_IPHONE)
                    // ok
#elif defined(__arm__) && !(__ARM_EABI__) // arm-oabi
                        // https://github.com/msgpack/msgpack-perl/pull/1
                        mem.i = (mem.i & 0xFFFFFFFFUL) << 32UL | (mem.i >> 32UL);
#endif
                        push_fixed_value(_double, mem.f); }
                case MSGPACK_CS_UINT_8:
                    push_fixed_value(_uint8, *(uint8_t*)n);
                case MSGPACK_CS_UINT_16:{
                    uint16_t tmp;
                    _msgpack_load16(uint16_t,n,&tmp);
                    push_fixed_value(_uint16, tmp);
                }
                case MSGPACK_CS_UINT_32:{
                    uint32_t tmp;
                    _msgpack_load32(uint32_t,n,&tmp);
                    push_fixed_value(_uint32, tmp);
                }
                case MSGPACK_CS_UINT_64:{
                    uint64_t tmp;
                    _msgpack_load64(uint64_t,n,&tmp);
                    push_fixed_value(_uint64, tmp);
                }
                case MSGPACK_CS_INT_8:
                    push_fixed_value(_int8, *(int8_t*)n);
                case MSGPACK_CS_INT_16:{
                    int16_t tmp;
                    _msgpack_load16(int16_t,n,&tmp);
                    push_fixed_value(_int16, tmp);
                }
                case MSGPACK_CS_INT_32:{
                    int32_t tmp;
                    _msgpack_load32(int32_t,n,&tmp);
                    push_fixed_value(_int32, tmp);
                }
                case MSGPACK_CS_INT_64:{
                    int64_t tmp;
                    _msgpack_load64(int64_t,n,&tmp);
                    push_fixed_value(_int64, tmp);
                }
                case MSGPACK_CS_FIXEXT_1:
                    again_fixed_trail_if_zero(MSGPACK_ACS_EXT_VALUE, 1+1, _ext_zero);
                case MSGPACK_CS_FIXEXT_2:
                    again_fixed_trail_if_zero(MSGPACK_ACS_EXT_VALUE, 2+1, _ext_zero);
                case MSGPACK_CS_FIXEXT_4:
                    again_fixed_trail_if_zero(MSGPACK_ACS_EXT_VALUE, 4+1, _ext_zero);
                case MSGPACK_CS_FIXEXT_8:
                    again_fixed_trail_if_zero(MSGPACK_ACS_EXT_VALUE, 8+1, _ext_zero);
                case MSGPACK_CS_FIXEXT_16:
                    again_fixed_trail_if_zero(MSGPACK_ACS_EXT_VALUE, 16+1, _ext_zero);
                case MSGPACK_CS_STR_8:
                    again_fixed_trail_if_zero(MSGPACK_ACS_STR_VALUE, *(uint8_t*)n, _str_zero);
                case MSGPACK_CS_BIN_8:
                    again_fixed_trail_if_zero(MSGPACK_ACS_BIN_VALUE, *(uint8_t*)n, _bin_zero);
                case MSGPACK_CS_EXT_8:
                    again_fixed_trail_if_zero(MSGPACK_ACS_EXT_VALUE, (*(uint8_t*)n) + 1, _ext_zero);
                case MSGPACK_CS_STR_16:{
                    uint16_t tmp;
                    _msgpack_load16(uint16_t,n,&tmp);
                    again_fixed_trail_if_zero(MSGPACK_ACS_STR_VALUE, tmp, _str_zero);
                }
                case MSGPACK_CS_BIN_16:{
                    uint16_t tmp;
                    _msgpack_load16(uint16_t,n,&tmp);
                    again_fixed_trail_if_zero(MSGPACK_ACS_BIN_VALUE, tmp, _bin_zero);
                }
                case MSGPACK_CS_EXT_16:{
                    uint16_t tmp;
                    _msgpack_load16(uint16_t,n,&tmp);
                    again_fixed_trail_if_zero(MSGPACK_ACS_EXT_VALUE, tmp + 1, _ext_zero);
                }
                case MSGPACK_CS_STR_32:{
                    uint32_t tmp;
                    _msgpack_load32(uint32_t,n,&tmp);
                    again_fixed_trail_if_zero(MSGPACK_ACS_STR_VALUE, tmp, _str_zero);
                }
                case MSGPACK_CS_BIN_32:{
                    uint32_t tmp;
                    _msgpack_load32(uint32_t,n,&tmp);
                    again_fixed_trail_if_zero(MSGPACK_ACS_BIN_VALUE, tmp, _bin_zero);
                }
                case MSGPACK_CS_EXT_32:{
                    uint32_t tmp;
                    _msgpack_load32(uint32_t,n,&tmp);
                    again_fixed_trail_if_zero(MSGPACK_ACS_EXT_VALUE, tmp + 1, _ext_zero);
                }
                case MSGPACK_ACS_STR_VALUE:
                _str_zero:
                    push_variable_value(_str, data, n, trail);
                case MSGPACK_ACS_BIN_VALUE:
                _bin_zero:
                    push_variable_value(_bin, data, n, trail);
                case MSGPACK_ACS_EXT_VALUE:
                _ext_zero:
                    push_variable_value(_ext, data, n, trail);

                case MSGPACK_CS_ARRAY_16:{
                    uint16_t tmp;
                    _msgpack_load16(uint16_t,n,&tmp);
                    start_container(_array, tmp, MSGPACK_CT_ARRAY_ITEM);
                }
                case MSGPACK_CS_ARRAY_32:{
                    /* FIXME security guard */
                    uint32_t tmp;
                    _msgpack_load32(uint32_t,n,&tmp);
                    start_container(_array, tmp, MSGPACK_CT_ARRAY_ITEM);
                }

                case MSGPACK_CS_MAP_16:{
                    uint16_t tmp;
                    _msgpack_load16(uint16_t,n,&tmp);
                    start_container(_map, tmp, MSGPACK_CT_MAP_KEY);
                }
                case MSGPACK_CS_MAP_32:{
                    /* FIXME security guard */
                    uint32_t tmp;
                    _msgpack_load32(uint32_t,n,&tmp);
                    start_container(_map, tmp, MSGPACK_CT_MAP_KEY);
                }

                default:
                    ret = MSGPACK_UNPACK_PARSE_ERROR;
                    goto _failed;
                }
            }

    _push:
        if(top == 0) { goto _finish; }
        c = &stack[top-1];
        switch(c->ct) {
        case MSGPACK_CT_ARRAY_ITEM:
            ret = msgpack_unpack_callback(_array_item)(user, &c->obj, obj); \
            if(ret < 0) { goto _failed; }
            if(--c->count == 0) {
                obj = c->obj;
                --top;
                /*printf("stack pop %d\n", top);*/
                goto _push;
            }
            goto _header_again;
        case MSGPACK_CT_MAP_KEY:
            c->map_key = obj;
            c->ct = MSGPACK_CT_MAP_VALUE;
            goto _header_again;
        case MSGPACK_CT_MAP_VALUE:
            ret = msgpack_unpack_callback(_map_item)(user, &c->obj, c->map_key, obj); \
            if(ret < 0) { goto _failed; }
            if(--c->count == 0) {
                obj = c->obj;
                --top;
                /*printf("stack pop %d\n", top);*/
                goto _push;
            }
            c->ct = MSGPACK_CT_MAP_KEY;
            goto _header_again;

        default:
            ret = MSGPACK_UNPACK_PARSE_ERROR;
            goto _failed;
        }

    _header_again:
            cs = MSGPACK_CS_HEADER;
            ++p;
        } while(p != pe);
        goto _out;


    _finish:
        stack[0].obj = obj;
        ++p;
        ret = 1;
        /*printf("-- finish --\n"); */
        goto _end;

    _failed:
        /*printf("** FAILED **\n"); */
        goto _end;

    _out:
        ret = 0;
        goto _end;

    _end:
        ctx->cs = cs;
        ctx->trail = trail;
        ctx->top = top;
        *off = (size_t)(p - (const unsigned char*)data);

        return ret;
    }
}